

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void process_args(int argc,char **argv)

{
  int iVar1;
  __gid_t _Var2;
  int iVar3;
  nh_roles_info *ri_00;
  char **ppcVar4;
  bool bVar5;
  nh_roles_info *ri;
  char **ppcStack_18;
  int i;
  char **argv_local;
  int argc_local;
  
  ri_00 = (nh_roles_info *)nh_get_roles();
  ppcVar4 = argv;
  iVar1 = argc;
  do {
    argv_local._4_4_ = iVar1;
    ppcStack_18 = ppcVar4;
    bVar5 = false;
    if (1 < argv_local._4_4_) {
      bVar5 = *ppcStack_18[1] == '-';
    }
    if (!bVar5) {
      return;
    }
    ppcVar4 = ppcStack_18 + 1;
    iVar1 = argv_local._4_4_ + -1;
    switch((*ppcVar4)[1]) {
    case '-':
      iVar1 = strcmp(*ppcVar4,"--help");
      if (iVar1 == 0) {
        puts("Usage: dynamohack [OPTIONS]");
        puts("");
        puts("--help      show this help and exit");
        puts("--version   show version number and exit");
        puts("-D          start games in wizard mode");
        puts("-X          start games in explore mode");
        puts("-u name     specify player name");
        puts("-p role     specify role");
        puts("-r race     specify race");
        puts("-@          specify a random character");
        puts("-H dir      override the data directory");
        puts("-V dir      override the variable data \"playground\" directory");
        puts("-U dir      override the user directory");
        exit(0);
      }
      iVar1 = strcmp(*ppcVar4,"--version");
      if (iVar1 == 0) {
        printf("DynaMoHack version %d.%d.%d\n",0,0,1);
        exit(0);
      }
      fprintf(_stderr,"Unrecognized option \'%s\'\n",*ppcVar4);
      exit(1);
    default:
      iVar3 = str2role(ri_00,*ppcVar4);
      if (-1 < iVar3) {
        initrole = iVar3;
      }
      break;
    case '@':
      random_player = '\x01';
      break;
    case 'D':
      ui_flags.playmode = 3;
      break;
    case 'H':
      _Var2 = getgid();
      iVar3 = setregid(0xffffffff,_Var2);
      if (iVar3 == -1) {
        perror("Error processing -H");
        exit(0xe);
      }
      if ((*ppcVar4)[2] == '\0') {
        if (iVar1 < 2) {
          fputs("data directory expected after -H\n",_stderr);
          exit(1);
        }
        override_hackdir = ppcStack_18[2];
        ppcVar4 = ppcStack_18 + 2;
        iVar1 = argv_local._4_4_ + -2;
      }
      else {
        override_hackdir = *ppcVar4 + 2;
      }
      break;
    case 'U':
      _Var2 = getgid();
      iVar3 = setregid(0xffffffff,_Var2);
      if (iVar3 == -1) {
        perror("Error processing -U");
        exit(0xe);
      }
      if ((*ppcVar4)[2] == '\0') {
        if (iVar1 < 2) {
          fputs("user directory expected after -U\n",_stderr);
          exit(1);
        }
        override_userdir = ppcStack_18[2];
        ppcVar4 = ppcStack_18 + 2;
        iVar1 = argv_local._4_4_ + -2;
      }
      else {
        override_userdir = *ppcVar4 + 2;
      }
      break;
    case 'V':
      _Var2 = getgid();
      iVar3 = setregid(0xffffffff,_Var2);
      if (iVar3 == -1) {
        perror("Error processing -V");
        exit(0xe);
      }
      if ((*ppcVar4)[2] == '\0') {
        if (iVar1 < 2) {
          fputs("variable data directory expected after -V\n",_stderr);
          exit(1);
        }
        override_vardir = ppcStack_18[2];
        ppcVar4 = ppcStack_18 + 2;
        iVar1 = argv_local._4_4_ + -2;
      }
      else {
        override_vardir = *ppcVar4 + 2;
      }
      break;
    case 'X':
      ui_flags.playmode = 2;
      break;
    case 'p':
      if ((*ppcVar4)[2] == '\0') {
        if (1 < iVar1) {
          ppcVar4 = ppcStack_18 + 2;
          iVar3 = str2role(ri_00,*ppcVar4);
          iVar1 = argv_local._4_4_ + -2;
          if (-1 < iVar3) {
            initrole = iVar3;
          }
        }
      }
      else {
        iVar3 = str2role(ri_00,*ppcVar4 + 2);
        if (-1 < iVar3) {
          initrole = iVar3;
        }
      }
      break;
    case 'r':
      if ((*ppcVar4)[2] == '\0') {
        if (1 < iVar1) {
          ppcVar4 = ppcStack_18 + 2;
          iVar3 = str2race(ri_00,*ppcVar4);
          iVar1 = argv_local._4_4_ + -2;
          if (-1 < iVar3) {
            initrace = iVar3;
          }
        }
      }
      else {
        iVar3 = str2race(ri_00,*ppcVar4 + 2);
        if (-1 < iVar3) {
          initrace = iVar3;
        }
      }
      break;
    case 'u':
      if ((*ppcVar4)[2] == '\0') {
        if (iVar1 < 2) {
          fputs("Player name expected after -u\n",_stderr);
          exit(1);
        }
        strncpy(settings.plname,ppcStack_18[2],0xff);
        ppcVar4 = ppcStack_18 + 2;
        iVar1 = argv_local._4_4_ + -2;
      }
      else {
        strncpy(settings.plname,*ppcVar4 + 2,0xff);
      }
    }
  } while( true );
}

Assistant:

static void process_args(int argc, char *argv[])
{
    int i;
    const struct nh_roles_info *ri = nh_get_roles();

    /*
     * Process options.
     */
    while (argc > 1 && argv[1][0] == '-') {
	argv++;
	argc--;
	switch (argv[0][1]) {
	case '-':
	    if (!strcmp(argv[0], "--help")) {
		puts("Usage: dynamohack [OPTIONS]");
		puts("");
		puts("--help      show this help and exit");
		puts("--version   show version number and exit");
		puts("-D          start games in wizard mode");
		puts("-X          start games in explore mode");
		puts("-u name     specify player name");
		puts("-p role     specify role");
		puts("-r race     specify race");
		puts("-@          specify a random character");
		puts("-H dir      override the data directory");
		puts("-V dir      override the variable data \"playground\" directory");
		puts("-U dir      override the user directory");
		exit(0);
	    } else if (!strcmp(argv[0], "--version")) {
		printf("DynaMoHack version %d.%d.%d\n",
		       VERSION_MAJOR, VERSION_MINOR, PATCHLEVEL);
		exit(0);
	    } else {
		fprintf(stderr, "Unrecognized option '%s'\n", argv[0]);
		exit(1);
	    }
	    break;

	case 'D':
	    ui_flags.playmode = MODE_WIZARD;
	    break;

	case 'X':
	    ui_flags.playmode = MODE_EXPLORE;
	    break;

	case 'u':
	    if (argv[0][2]) {
		/* -uname */
		strncpy(settings.plname, argv[0]+2, sizeof(settings.plname)-1);
	    } else if (argc > 1) {
		/* -u name */
		argc--;
		argv++;
		strncpy(settings.plname, argv[0], sizeof(settings.plname)-1);
	    } else {
		fputs("Player name expected after -u\n", stderr);
		exit(1);
	    }
	    break;

	case 'p': /* profession (role) */
	    if (argv[0][2]) {
		i = str2role(ri, &argv[0][2]);
		if (i >= 0)
		    initrole = i;
	    } else if (argc > 1) {
		argc--;
		argv++;
		i = str2role(ri, argv[0]);
		if (i >= 0)
		    initrole = i;
	    }
	    break;

	case 'r': /* race */
	    if (argv[0][2]) {
		i = str2race(ri, &argv[0][2]);
		if (i >= 0)
		    initrace = i;
	    } else if (argc > 1) {
		argc--;
		argv++;
		i = str2race(ri, argv[0]);
		if (i >= 0)
		    initrace = i;
	    }
	    break;

	case '@':
	    random_player = TRUE;
	    break;

	case 'H':
#ifdef UNIX
	    if (setregid(-1, getgid()) == -1) {
		perror("Error processing -H");
		exit(14);
	    }
#endif
	    if (argv[0][2]) {
		/* -Hdir */
		override_hackdir = argv[0] + 2;
	    } else if (argc > 1) {
		/* -H dir */
		argv++;
		argc--;
		override_hackdir = argv[0];
	    } else {
		fputs("data directory expected after -H\n", stderr);
		exit(1);
	    }
	    break;

	case 'V':
#ifdef UNIX
	    if (setregid(-1, getgid()) == -1) {
		perror("Error processing -V");
		exit(14);
	    }
#endif
	    if (argv[0][2]) {
		/* -Vdir */
		override_vardir = argv[0] + 2;
	    } else if (argc > 1) {
		/* -V dir */
		argv++;
		argc--;
		override_vardir = argv[0];
	    } else {
		fputs("variable data directory expected after -V\n", stderr);
		exit(1);
	    }
	    break;

	case 'U':
#ifdef UNIX
	    if (setregid(-1, getgid()) == -1) {
		perror("Error processing -U");
		exit(14);
	    }
#endif
	    if (argv[0][2]) {
		/* -Udir */
		override_userdir = argv[0] + 2;
	    } else if (argc > 1) {
		/* -U dir */
		argv++;
		argc--;
		override_userdir = argv[0];
	    } else {
		fputs("user directory expected after -U\n", stderr);
		exit(1);
	    }
	    break;

	default:
	    i = str2role(ri, argv[0]);
	    if (i >= 0)
		initrole = i;
	}
    }
}